

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::maybe<toml::detail::character<'"'>_>::invoke
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  bool bVar1;
  region local_108;
  success<toml::detail::region> local_c0;
  undefined4 local_78;
  undefined1 local_68 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  location *loc_local;
  
  rslt.field_1.succ.value.last_._M_current = (const_iterator)loc;
  character<'"'>::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_68,loc);
  bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_ok
                    ((result<toml::detail::region,_toml::detail::none_t> *)local_68);
  if (bVar1) {
    result<toml::detail::region,_toml::detail::none_t>::result
              (__return_storage_ptr__,(result<toml::detail::region,_toml::detail::none_t> *)local_68
              );
  }
  else {
    region::region(&local_108,(location *)rslt.field_1.succ.value.last_._M_current);
    ok<toml::detail::region>(&local_c0,&local_108);
    result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_c0);
    success<toml::detail::region>::~success(&local_c0);
    region::~region(&local_108);
  }
  local_78 = 1;
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto rslt = Combinator::invoke(loc);
        if(rslt.is_ok())
        {
            return rslt;
        }
        return ok(region(loc));
    }